

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O2

ParameterInfo * __thiscall
C3DFile::getParamInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,char *id_str)

{
  char cVar1;
  pointer pGVar2;
  pointer pPVar3;
  char *__s1;
  char *__s1_00;
  int iVar4;
  long lVar5;
  pointer pGVar6;
  pointer info;
  string group;
  string param;
  string id_string;
  char *local_b0;
  undefined8 local_a8;
  char local_a0 [16];
  char *local_90;
  undefined8 local_88;
  char local_80 [16];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_70,id_str,(allocator<char> *)&local_b0);
  lVar5 = std::__cxx11::string::find((char *)local_70,0x10b5fb);
  if (lVar5 == -1) {
    __assert_fail("id_string.find(\":\") != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x19a,"ParameterInfo C3DFile::getParamInfo(const char *)");
  }
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = '\0';
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = '\0';
  std::__cxx11::string::find((char *)local_70,0x10b5fb);
  std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
  std::__cxx11::string::operator=((string *)&local_b0,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::find((char *)local_70,0x10b5fb);
  std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
  std::__cxx11::string::operator=((string *)&local_90,local_50);
  std::__cxx11::string::~string(local_50);
  __s1 = local_b0;
  pGVar6 = (this->group_infos).super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (this->group_infos).super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pGVar6 == pGVar2) {
      __assert_fail("group_iter != group_infos.end() && \"Could not find group!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                    ,0x1b0,"ParameterInfo C3DFile::getParamInfo(const char *)");
    }
    iVar4 = strcmp(__s1,pGVar6->name);
    __s1_00 = local_90;
    if (iVar4 == 0) break;
    pGVar6 = pGVar6 + 1;
  }
  cVar1 = pGVar6->id;
  info = (this->param_infos).super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (this->param_infos).super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (info == pPVar3) {
      __assert_fail("param_iter != param_infos.end() && \"Could not find parameter with the specified group\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                    ,0x1bc,"ParameterInfo C3DFile::getParamInfo(const char *)");
    }
    iVar4 = strncmp(__s1_00,info->name,(long)info->name_length);
    if ((iVar4 == 0) && ((int)info->group_id == -(int)cVar1)) break;
    info = info + 1;
  }
  ParameterInfo::ParameterInfo(__return_storage_ptr__,info);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

ParameterInfo C3DFile::getParamInfo (const char *id_str) {
	std::string id_string (id_str);
	assert (id_string.find(":") != std::string::npos);

	std::string group;
	std::string param;

	group = id_string.substr(0, id_string.find(":"));
	param = id_string.substr(id_string.find(":") + 1, id_string.length());

//	std::cout << "group = " << group << " param = " << param << std::endl;

	Sint8 group_id = -1;

	// search for the group id first as we need to find the parameter with the
	// given id
	std::vector<GroupInfo>::const_iterator group_iter = group_infos.begin();
	while (group_iter != group_infos.end()) {
		if (!strcmp(group.c_str(), group_iter->name)) {
			group_id = group_iter->id;
			break;
		}
		group_iter ++;
	}
	assert (group_iter != group_infos.end() && "Could not find group!");

	std::vector<ParameterInfo>::const_iterator param_iter = param_infos.begin();

	while (param_iter != param_infos.end()) {
		if (!strncmp(param.c_str(), param_iter->name, param_iter->name_length)
				&& param_iter->group_id == -group_id) {
			break;
		}
		param_iter++;
	}

	assert (param_iter != param_infos.end() && "Could not find parameter with the specified group");

	/*
	std::cout << "Group id = " << static_cast<int>(group_id)
		<< " param_iter->name = " << param_iter->name
		<< " param_iter->group_id = " << static_cast<int>(param_iter->group_id) << std::endl;
	*/
	
	return *param_iter;
}